

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

IVal * deqp::gls::BuiltinPrecisionTests::
       ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doUnion
                 (IVal *__return_storage_ptr__,IVal *a,IVal *b)

{
  bool *pbVar1;
  long lVar2;
  undefined8 local_40;
  double dStack_38;
  undefined8 local_30;
  
  tcu::Vector<tcu::Interval,_3>::Vector(__return_storage_ptr__);
  for (lVar2 = 0; lVar2 != 0x48; lVar2 = lVar2 + 0x18) {
    tcu::Interval::operator|
              ((Interval *)(&a->m_data[0].m_hasNaN + lVar2),
               (Interval *)(&b->m_data[0].m_hasNaN + lVar2));
    *(undefined8 *)((long)&__return_storage_ptr__->m_data[0].m_hi + lVar2) = local_30;
    pbVar1 = &__return_storage_ptr__->m_data[0].m_hasNaN + lVar2;
    *(undefined8 *)pbVar1 = local_40;
    *(double *)(pbVar1 + 8) = dStack_38;
  }
  return __return_storage_ptr__;
}

Assistant:

static IVal			doUnion			(const IVal& a, const IVal& b)
	{
		IVal ret;

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			ret[ndx] = unionIVal<Element>(a[ndx], b[ndx]);

		return ret;
	}